

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O1

void CoreML::KNNValidatorTests::addDataPoints(KNearestNeighborsClassifier *nnModel)

{
  int iVar1;
  void *pvVar2;
  NearestNeighborsIndex *pNVar3;
  Type *pTVar4;
  RepeatedPtrField<CoreML::Specification::FloatVector> *this;
  pointer pvVar5;
  size_t j;
  long lVar6;
  size_t i;
  long lVar7;
  float fVar8;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<std::vector<float,_std::allocator<float>_>_> __l_05;
  vector<float,_std::allocator<float>_> point2b;
  vector<float,_std::allocator<float>_> point2;
  vector<float,_std::allocator<float>_> point1b;
  vector<float,_std::allocator<float>_> point1;
  vector<float,_std::allocator<float>_> point0b;
  vector<float,_std::allocator<float>_> point0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  points;
  allocator_type local_165;
  float local_164;
  vector<float,_std::allocator<float>_> local_160;
  vector<float,_std::allocator<float>_> local_148;
  vector<float,_std::allocator<float>_> local_130;
  vector<float,_std::allocator<float>_> local_118;
  vector<float,_std::allocator<float>_> local_100;
  vector<float,_std::allocator<float>_> local_e8;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_d0;
  vector<float,_std::allocator<float>_> local_b8;
  vector<float,_std::allocator<float>_> local_a0;
  vector<float,_std::allocator<float>_> local_88;
  vector<float,_std::allocator<float>_> local_70;
  vector<float,_std::allocator<float>_> local_58;
  vector<float,_std::allocator<float>_> local_40;
  
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&local_e8,__l,(allocator_type *)&local_100);
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3dcccccd00000000;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&local_100,__l_00,(allocator_type *)&local_118)
  ;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f800000;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&local_118,__l_01,(allocator_type *)&local_130)
  ;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f800000;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3dcccccd;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&local_130,__l_02,(allocator_type *)&local_148)
  ;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x40066666;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&local_148,__l_03,(allocator_type *)&local_160)
  ;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x40066666;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3dcccccd00000000;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&local_160,__l_04,(allocator_type *)&local_d0);
  std::vector<float,_std::allocator<float>_>::vector(&local_b8,&local_e8);
  std::vector<float,_std::allocator<float>_>::vector(&local_a0,&local_118);
  std::vector<float,_std::allocator<float>_>::vector(&local_88,&local_148);
  std::vector<float,_std::allocator<float>_>::vector(&local_70,&local_100);
  std::vector<float,_std::allocator<float>_>::vector(&local_58,&local_130);
  std::vector<float,_std::allocator<float>_>::vector(&local_40,&local_160);
  __l_05._M_len = 6;
  __l_05._M_array = &local_b8;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&local_d0,__l_05,&local_165);
  lVar7 = 0x90;
  do {
    pvVar2 = *(void **)((long)&local_d0.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar7);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&local_d0.
                                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar7) - (long)pvVar2);
    }
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != 0);
  if (nnModel->nearestneighborsindex_ == (NearestNeighborsIndex *)0x0) {
    pNVar3 = (NearestNeighborsIndex *)operator_new(0x50);
    Specification::NearestNeighborsIndex::NearestNeighborsIndex(pNVar3);
    nnModel->nearestneighborsindex_ = pNVar3;
  }
  pNVar3 = nnModel->nearestneighborsindex_;
  pNVar3->numberofdimensions_ = 4;
  this = &pNVar3->floatsamples_;
  lVar7 = 0;
  do {
    google::protobuf::internal::RepeatedPtrFieldBase::
    Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
              (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
    pvVar5 = local_d0.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar7;
    lVar6 = 0;
    do {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,(int)lVar7);
      fVar8 = (pvVar5->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar6];
      iVar1 = (pTVar4->vector_).total_size_;
      if ((pTVar4->vector_).current_size_ == iVar1) {
        local_164 = fVar8;
        google::protobuf::RepeatedField<float>::Reserve(&pTVar4->vector_,iVar1 + 1);
        fVar8 = local_164;
      }
      iVar1 = (pTVar4->vector_).current_size_;
      (pTVar4->vector_).current_size_ = iVar1 + 1;
      ((pTVar4->vector_).rep_)->elements[iVar1] = fVar8;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_d0);
  if (local_160.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_160.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void addDataPoints(Specification::KNearestNeighborsClassifier* nnModel) {

        std::vector<float> point0 = {0, 0, 0, 0};
        std::vector<float> point0b = {0, 0.1f, 0, 0};

        std::vector<float> point1 = {1, 0, 0, 0};
        std::vector<float> point1b = {1, 0, 0.1f, 0};

        std::vector<float> point2 = {2.1f, 0, 0, 0};
        std::vector<float> point2b = {2.1f, 0, 0, 0.1f};

        std::vector<std::vector<float>> points = {point0, point1, point2, point0b, point1b, point2b};
        size_t pointCount = 6;

        auto *nnIndex = nnModel->mutable_nearestneighborsindex();
        nnIndex->set_numberofdimensions(4);

        for (size_t i = 0; i < pointCount; i++) {
            nnIndex->add_floatsamples();
            const auto& sample = points[i];
            for (size_t j = 0; j < 4; j++) {
                nnIndex->mutable_floatsamples((int)i)->add_vector(sample[j]);
            }
        }

    }